

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::JavascriptPromiseResolveThenableTaskFunction>(RecyclableObject *obj)

{
  bool bVar1;
  undefined1 local_19;
  RecyclableObject *obj_local;
  
  bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  if (bVar1) {
    bVar1 = VirtualTableInfo<Js::JavascriptPromiseResolveThenableTaskFunction>::HasVirtualTable(obj)
    ;
    local_19 = true;
    if (!bVar1) {
      local_19 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseResolveThenableTaskFunction>_>
                 ::HasVirtualTable(obj);
    }
    obj_local._7_1_ = local_19;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool VarIsImpl<JavascriptPromiseResolveThenableTaskFunction>(RecyclableObject* obj)
    {
        if (VarIs<JavascriptFunction>(obj))
        {
            return VirtualTableInfo<JavascriptPromiseResolveThenableTaskFunction>::HasVirtualTable(obj)
                || VirtualTableInfo<CrossSiteObject<JavascriptPromiseResolveThenableTaskFunction>>::HasVirtualTable(obj);
        }

        return false;
    }